

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFEFStreamObjectHelper.cc
# Opt level: O0

size_t __thiscall QPDFEFStreamObjectHelper::getSize(QPDFEFStreamObjectHelper *this)

{
  bool bVar1;
  uint local_60 [5];
  allocator<char> local_49;
  string local_48 [32];
  QPDFObjectHandle val;
  QPDFEFStreamObjectHelper *this_local;
  
  val.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,"/Size",&local_49);
  getParam((QPDFEFStreamObjectHelper *)&stack0xffffffffffffffd8,(string *)this);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  bVar1 = QPDFObjectHandle::isInteger((QPDFObjectHandle *)&stack0xffffffffffffffd8);
  if (bVar1) {
    local_60[0] = QPDFObjectHandle::getUIntValueAsUInt((QPDFObjectHandle *)&stack0xffffffffffffffd8)
    ;
    this_local = (QPDFEFStreamObjectHelper *)QIntC::to_size<unsigned_int>(local_60);
  }
  else {
    this_local = (QPDFEFStreamObjectHelper *)0x0;
  }
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&stack0xffffffffffffffd8);
  return (size_t)this_local;
}

Assistant:

size_t
QPDFEFStreamObjectHelper::getSize()
{
    auto val = getParam("/Size");
    if (val.isInteger()) {
        return QIntC::to_size(val.getUIntValueAsUInt());
    }
    return 0;
}